

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>::operator()
          (arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> *this,handle handle)

{
  iterator iVar1;
  basic_format_parse_context<char,_fmt::v7::detail::error_handler> *in_RDX;
  char *in_RSI;
  parse_context_type *in_RDI;
  parse_context_type *this_00;
  
  this_00 = in_RDI;
  if (*(long *)&in_RDI[1].next_arg_id_ != 0) {
    advance_to<char,fmt::v7::detail::error_handler>(in_RDX,in_RSI);
  }
  basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  handle::format((handle *)this_00,in_RDI,
                 (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)0x18cbfa);
  iVar1 = basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::out
                    ((basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)
                     in_RDI[1].format_str_.data_);
  return (iterator)
         iVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

iterator operator()(typename basic_format_arg<context_type>::handle handle) {
    if (ptr_) advance_to(*parse_ctx_, ptr_);
    handle.format(*parse_ctx_, ctx_);
    return ctx_.out();
  }